

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O3

void __thiscall
ON_Annotation::SetMaskFrameType(ON_Annotation *this,ON_DimStyle *parent_style,MaskFrame value)

{
  MaskFrame MVar1;
  ON_DimStyle *pOVar2;
  
  pOVar2 = ON_DimStyle::DimStyleOrDefault(parent_style);
  MVar1 = ON_DimStyle::MaskFrameType(pOVar2);
  pOVar2 = Internal_GetOverrideStyle(this,MVar1 != value);
  if (pOVar2 != (ON_DimStyle *)0x0) {
    ON_DimStyle::SetMaskFrameType(pOVar2,value);
    ON_DimStyle::SetFieldOverride(pOVar2,MaskFrameType,MVar1 != value);
    return;
  }
  return;
}

Assistant:

void ON_Annotation::SetMaskFrameType(const ON_DimStyle* parent_style, ON_TextMask::MaskFrame value)
{
  parent_style = &ON_DimStyle::DimStyleOrDefault(parent_style);
  bool bCreate = (value != parent_style->MaskFrameType());
  ON_DimStyle* override_style = Internal_GetOverrideStyle(bCreate);
  if (nullptr != override_style)
  {
    override_style->SetMaskFrameType(value);
    override_style->SetFieldOverride(ON_DimStyle::field::MaskFrameType, bCreate);
  }
}